

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * soul::makeIdentifierRemovingColons(string *__return_storage_ptr__,string *s)

{
  string_view firstReplacement;
  string_view firstToReplace;
  size_t in_stack_ffffffffffffffa8;
  _Alloc_hider in_stack_ffffffffffffffb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  string local_30;
  
  trimCharacterAtStart(&local_30,s,':');
  firstReplacement._M_str = in_stack_ffffffffffffffb0._M_p;
  firstReplacement._M_len = in_stack_ffffffffffffffa8;
  firstToReplace._M_str = (char *)0x1;
  firstToReplace._M_len = (size_t)"::";
  choc::text::replace<std::__cxx11::string>
            ((string *)&stack0xffffffffffffffb0,(text *)&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2,firstToReplace
             ,firstReplacement);
  makeSafeIdentifierName(__return_storage_ptr__,(string *)&stack0xffffffffffffffb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffb0._M_p != &local_40) {
    operator_delete(in_stack_ffffffffffffffb0._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeIdentifierRemovingColons (std::string s)
{
    return makeSafeIdentifierName (choc::text::replace (trimCharacterAtStart (s, ':'), "::", "_"));
}